

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

void __thiscall
CMU462::HalfedgeMesh::buildSubdivisionFaceList
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *subDFaces)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  initializer_list<unsigned_long> __l;
  allocator_type local_71;
  _List_node_base *local_70;
  unsigned_long local_68;
  undefined8 local_60;
  _List_node_base *local_58;
  undefined8 local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  p_Var2 = (_List_node_base *)&this->faces;
  local_70 = p_Var2;
  while (p_Var2 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var2 != local_70) {
    p_Var1 = p_Var2[0xb]._M_prev;
    do {
      local_68 = *(unsigned_long *)(*(long *)((long)p_Var1[2]._M_next + 0x28) + 0x60);
      local_60 = *(undefined8 *)(*(long *)((long)p_Var1[2]._M_next + 0x30) + 0x30);
      local_58 = p_Var2[1]._M_prev;
      local_50 = *(undefined8 *)((long)p_Var1[3]._M_next + 0x30);
      __l._M_len = 4;
      __l._M_array = &local_68;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,__l,&local_71);
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  *)subDFaces,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      p_Var1 = p_Var1[2]._M_next;
    } while (p_Var2[0xb]._M_prev != p_Var1);
  }
  return;
}

Assistant:

void HalfedgeMesh::buildSubdivisionFaceList(vector<vector<Index> >& subDFaces) {
	// TODO This routine is perhaps the most tricky step in the construction of
	// a subdivision mesh (second, perhaps, to computing the actual Catmull-Clark
	// vertex positions).  Basically what you want to do is iterate over faces,
	// then for each for each face, append N quads to the list (where N is the
	// degree of the face).  For this routine, it may be more convenient to simply
	// append quads to the end of the list (rather than allocating it ahead of
	// time), though YMMV.  You can of course iterate around a face by starting
	// with its first halfedge and following the "next" pointer until you get
	// back to the beginning.  The tricky part is making sure you grab the right
	// indices in the right order---remember that there are indices on vertices,
	// edges, AND faces of the original mesh.  All of these should get used.  Also
	// remember that you must have FOUR indices per face, since you are making a
	// QUAD mesh!

	// TODO iterate over faces
	// TODO loop around face
	// TODO build lists of four indices for each sub-quad
	// TODO append each list of four indices to face list
	for (FaceIter f = facesBegin(); f != facesEnd(); f++) {
		HalfedgeIter it = f->halfedge();
		HalfedgeIter it2 = it->next();
		do {
			subDFaces.push_back({ it2->vertex()->index,it2->edge()->index, f->index,it->edge()->index });
			it = it->next();
			it2 = it->next();
		} while (it != f->halfedge());
	}

	//showError("buildSubdivisionFaceList() not implemented.");
}